

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O2

UChar * __thiscall
icu_63::BMPSet::spanBack(BMPSet *this,UChar *s,UChar *limit,USetSpanCondition spanCondition)

{
  UChar UVar1;
  UChar *pUVar2;
  char cVar3;
  UBool UVar4;
  uint uVar5;
  int32_t iVar6;
  int32_t iVar7;
  
  if (spanCondition == USET_SPAN_NOT_CONTAINED) {
    do {
      pUVar2 = limit + -1;
      UVar1 = limit[-1];
      if ((ushort)UVar1 < 0x100) {
        cVar3 = this->latin1Contains[(ushort)UVar1];
joined_r0x002f62d2:
        if (cVar3 != '\0') {
          return limit;
        }
      }
      else {
        if ((ushort)UVar1 < 0x800) {
          uVar5 = this->table7FF[(ushort)UVar1 & 0x3f] >> ((ushort)UVar1 >> 6 & 0x1f) & 1;
        }
        else {
          if (0xf7ff < (ushort)(UVar1 + L'\x2000')) {
            if ((pUVar2 == s || (ushort)UVar1 < 0xdc00) || ((ushort)(limit[-2] + L'␀') < 0xfc00))
            {
              iVar7 = this->list4kStarts[0xd];
              iVar6 = this->list4kStarts[0xe];
              goto LAB_002f62c8;
            }
            UVar4 = containsSlow(this,(uint)(ushort)UVar1 + (uint)(ushort)limit[-2] * 0x400 +
                                      -0x35fdc00,this->list4kStarts[0x10],this->list4kStarts[0x11]);
            if (UVar4 != '\0') {
              return limit;
            }
            pUVar2 = limit + -2;
            goto LAB_002f62d4;
          }
          uVar5 = *(uint *)((long)this->bmpBlockBits + (ulong)((ushort)UVar1 >> 4 & 0xfc)) >>
                  (byte)((ushort)UVar1 >> 0xc) & 0x10001;
          if (1 < uVar5) {
            iVar7 = this->list4kStarts[(ushort)UVar1 >> 0xc];
            iVar6 = this->list4kStarts[(ulong)((ushort)UVar1 >> 0xc) + 1];
LAB_002f62c8:
            cVar3 = containsSlow(this,(uint)(ushort)UVar1,iVar7,iVar6);
            goto joined_r0x002f62d2;
          }
        }
        if (uVar5 != 0) {
          return limit;
        }
      }
LAB_002f62d4:
      limit = pUVar2;
    } while (limit != s);
  }
  else {
    do {
      pUVar2 = limit + -1;
      UVar1 = limit[-1];
      if ((ushort)UVar1 < 0x100) {
        cVar3 = this->latin1Contains[(ushort)UVar1];
joined_r0x002f6186:
        if (cVar3 == '\0') {
          return limit;
        }
      }
      else {
        if ((ushort)UVar1 < 0x800) {
          uVar5 = this->table7FF[(ushort)UVar1 & 0x3f] >> ((ushort)UVar1 >> 6 & 0x1f) & 1;
        }
        else {
          if (0xf7ff < (ushort)(UVar1 + L'\x2000')) {
            if ((pUVar2 == s || (ushort)UVar1 < 0xdc00) || ((ushort)(limit[-2] + L'␀') < 0xfc00))
            {
              iVar7 = this->list4kStarts[0xd];
              iVar6 = this->list4kStarts[0xe];
              goto LAB_002f617c;
            }
            UVar4 = containsSlow(this,(uint)(ushort)UVar1 + (uint)(ushort)limit[-2] * 0x400 +
                                      -0x35fdc00,this->list4kStarts[0x10],this->list4kStarts[0x11]);
            if (UVar4 == '\0') {
              return limit;
            }
            pUVar2 = limit + -2;
            goto LAB_002f618c;
          }
          uVar5 = *(uint *)((long)this->bmpBlockBits + (ulong)((ushort)UVar1 >> 4 & 0xfc)) >>
                  (byte)((ushort)UVar1 >> 0xc) & 0x10001;
          if (1 < uVar5) {
            iVar7 = this->list4kStarts[(ushort)UVar1 >> 0xc];
            iVar6 = this->list4kStarts[(ulong)((ushort)UVar1 >> 0xc) + 1];
LAB_002f617c:
            cVar3 = containsSlow(this,(uint)(ushort)UVar1,iVar7,iVar6);
            goto joined_r0x002f6186;
          }
        }
        if (uVar5 == 0) {
          return limit;
        }
      }
LAB_002f618c:
      limit = pUVar2;
    } while (limit != s);
  }
  return s;
}

Assistant:

const UChar *
BMPSet::spanBack(const UChar *s, const UChar *limit, USetSpanCondition spanCondition) const {
    UChar c, c2;

    if(spanCondition) {
        // span
        for(;;) {
            c=*(--limit);
            if(c<=0xff) {
                if(!latin1Contains[c]) {
                    break;
                }
            } else if(c<=0x7ff) {
                if((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))==0) {
                    break;
                }
            } else if(c<0xd800 || c>=0xe000) {
                int lead=c>>12;
                uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
                if(twoBits<=1) {
                    // All 64 code points with the same bits 15..6
                    // are either in the set or not.
                    if(twoBits==0) {
                        break;
                    }
                } else {
                    // Look up the code point in its 4k block of code points.
                    if(!containsSlow(c, list4kStarts[lead], list4kStarts[lead+1])) {
                        break;
                    }
                }
            } else if(c<0xdc00 || s==limit || (c2=*(limit-1))<0xd800 || c2>=0xdc00) {
                // surrogate code point
                if(!containsSlow(c, list4kStarts[0xd], list4kStarts[0xe])) {
                    break;
                }
            } else {
                // surrogate pair
                if(!containsSlow(U16_GET_SUPPLEMENTARY(c2, c), list4kStarts[0x10], list4kStarts[0x11])) {
                    break;
                }
                --limit;
            }
            if(s==limit) {
                return s;
            }
        }
    } else {
        // span not
        for(;;) {
            c=*(--limit);
            if(c<=0xff) {
                if(latin1Contains[c]) {
                    break;
                }
            } else if(c<=0x7ff) {
                if((table7FF[c&0x3f]&((uint32_t)1<<(c>>6)))!=0) {
                    break;
                }
            } else if(c<0xd800 || c>=0xe000) {
                int lead=c>>12;
                uint32_t twoBits=(bmpBlockBits[(c>>6)&0x3f]>>lead)&0x10001;
                if(twoBits<=1) {
                    // All 64 code points with the same bits 15..6
                    // are either in the set or not.
                    if(twoBits!=0) {
                        break;
                    }
                } else {
                    // Look up the code point in its 4k block of code points.
                    if(containsSlow(c, list4kStarts[lead], list4kStarts[lead+1])) {
                        break;
                    }
                }
            } else if(c<0xdc00 || s==limit || (c2=*(limit-1))<0xd800 || c2>=0xdc00) {
                // surrogate code point
                if(containsSlow(c, list4kStarts[0xd], list4kStarts[0xe])) {
                    break;
                }
            } else {
                // surrogate pair
                if(containsSlow(U16_GET_SUPPLEMENTARY(c2, c), list4kStarts[0x10], list4kStarts[0x11])) {
                    break;
                }
                --limit;
            }
            if(s==limit) {
                return s;
            }
        }
    }
    return limit+1;
}